

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Vfs_umask(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  int iVar2;
  jx9_value *pjVar3;
  undefined4 uVar4;
  
  pvVar1 = pCtx->pFunc->pUserData;
  if ((pvVar1 == (void *)0x0) || (*(long *)((long)pvVar1 + 0x120) == 0)) {
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS",
               (pCtx->pFunc->sName).zString);
    pjVar3 = pCtx->pRet;
    jx9MemObjRelease(pjVar3);
    (pjVar3->x).rVal = 0.0;
  }
  else {
    if (nArg < 1) {
      uVar4 = 0;
    }
    else {
      pjVar3 = *apArg;
      jx9MemObjToInteger(pjVar3);
      uVar4 = *(undefined4 *)&pjVar3->x;
    }
    iVar2 = (**(code **)((long)pvVar1 + 0x120))(uVar4);
    pjVar3 = pCtx->pRet;
    jx9MemObjRelease(pjVar3);
    pjVar3->x = (anon_union_8_3_18420de5_for_x)(long)iVar2;
  }
  pjVar3->iFlags = pjVar3->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Vfs_umask(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int iOld, iNew;
	jx9_vfs *pVfs;
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xUmask == 0 ){
		/* IO routine not implemented, return -1 */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS", 
			jx9_function_name(pCtx)
			);
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	iNew = 0;
	if( nArg > 0 ){
		iNew = jx9_value_to_int(apArg[0]);
	}
	/* Perform the requested operation */
	iOld = pVfs->xUmask(iNew);
	/* Old mask */
	jx9_result_int(pCtx, iOld);
	return JX9_OK;
}